

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O3

void __thiscall
SkylineBinPack::Insert
          (SkylineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst)

{
  DisjointRectCollection *this_00;
  Rect *pRVar1;
  long lVar2;
  Rect RVar3;
  TArray<Rect,_Rect> *this_01;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int index;
  int score2;
  int score1;
  Rect bestNode;
  int local_74;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  Rect local_60;
  TArray<Rect,_Rect> *local_50;
  Rect local_48;
  
  if (dst->Count != 0) {
    dst->Count = 0;
  }
  if (*(int *)(rects + 0xc) != 0) {
    this_00 = &this->disjointRects;
    local_50 = dst;
    do {
      local_70 = 0xffffffff;
      iVar6 = 0x7fffffff;
      uVar8 = 0;
      iVar7 = 0x7fffffff;
      local_74 = -1;
      do {
        local_60 = FindPositionForNewNodeMinWaste
                             (this,*(int *)(*(long *)rects + uVar8 * 8),
                              *(int *)(*(long *)rects + 4 + uVar8 * 8),&local_68,&local_64,&local_6c
                             );
        bVar4 = DisjointRectCollection::Disjoint(this_00,&local_60);
        RVar3 = local_60;
        if (!bVar4) {
          __assert_fail("disjointRects.Disjoint(newNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                        ,0x49,"void SkylineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &)");
        }
        if ((local_60.height != 0) &&
           ((local_64 < iVar6 || ((local_64 == iVar6 && (local_68 < iVar7)))))) {
          local_48.x = local_60.x;
          local_48.y = local_60.y;
          local_48.width = local_60.width;
          local_48.height = local_60.height;
          local_74 = local_6c;
          local_70 = (uint)uVar8;
          iVar6 = local_64;
          iVar7 = local_68;
        }
        uVar8 = uVar8 + 1;
        local_60 = RVar3;
      } while (uVar8 < *(uint *)(rects + 0xc));
      if (local_70 == 0xffffffff) {
        return;
      }
      bVar4 = DisjointRectCollection::Disjoint(this_00,&local_48);
      if (!bVar4) {
        __assert_fail("disjointRects.Disjoint(bestNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x5d,"void SkylineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &)");
      }
      DisjointRectCollection::Add(this_00,&local_48);
      AddSkylineLevel(this,local_74,&local_48);
      this_01 = local_50;
      lVar2 = *(long *)rects;
      this->usedSurfaceArea =
           this->usedSurfaceArea +
           (long)*(int *)(lVar2 + 4 + (long)(int)local_70 * 8) *
           (long)*(int *)(lVar2 + (long)(int)local_70 * 8);
      if (local_70 < *(uint *)(rects + 0xc)) {
        uVar5 = *(uint *)(rects + 0xc) - 1;
        *(uint *)(rects + 0xc) = uVar5;
        if (local_70 <= uVar5 && uVar5 - local_70 != 0) {
          memmove((void *)(lVar2 + (ulong)local_70 * 8),(void *)(lVar2 + (ulong)local_70 * 8 + 8),
                  (ulong)(uVar5 - local_70) << 3);
        }
      }
      TArray<Rect,_Rect>::Grow(this_01,1);
      pRVar1 = this_01->Array + this_01->Count;
      pRVar1->x = local_48.x;
      pRVar1->y = local_48.y;
      pRVar1->width = local_48.width;
      pRVar1->height = local_48.height;
      this_01->Count = this_01->Count + 1;
    } while (*(int *)(rects + 0xc) != 0);
  }
  return;
}

Assistant:

void SkylineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst)
{
	dst.Clear();

	while(rects.Size() > 0)
	{
		Rect bestNode;
		int bestScore1 = INT_MAX;
		int bestScore2 = INT_MAX;
		int bestSkylineIndex = -1;
		int bestRectIndex = -1;
		for(unsigned i = 0; i < rects.Size(); ++i)
		{
			Rect newNode;
			int score1;
			int score2;
			int index;
			newNode = FindPositionForNewNodeMinWaste(rects[i].width, rects[i].height, score2, score1, index);
#ifdef _DEBUG
			assert(disjointRects.Disjoint(newNode));
#endif
			if (newNode.height != 0)
			{
				if (score1 < bestScore1 || (score1 == bestScore1 && score2 < bestScore2))
				{
					bestNode = newNode;
					bestScore1 = score1;
					bestScore2 = score2;
					bestSkylineIndex = index;
					bestRectIndex = i;
				}
			}
		}

		if (bestRectIndex == -1)
			return;

		// Perform the actual packing.
#ifdef _DEBUG
		assert(disjointRects.Disjoint(bestNode));
		disjointRects.Add(bestNode);
#endif
		AddSkylineLevel(bestSkylineIndex, bestNode);
		usedSurfaceArea += rects[bestRectIndex].width * rects[bestRectIndex].height;
		rects.Delete(bestRectIndex);
		dst.Push(bestNode);
	}
}